

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::BindToCreateCase::iterate(BindToCreateCase *this)

{
  ostringstream *this_00;
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  char *description;
  GLuint buffer;
  CallLogWrapper gl;
  VertexArray vao;
  Enum<int,_2UL> local_1b0;
  MessageBuilder local_1a0;
  
  buffer = 0;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).m_context)->m_testCtx->m_log);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_TestCase).m_context)->m_renderCtx);
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGenBuffers(&gl,1,&buffer);
  glu::CallLogWrapper::glDeleteBuffers(&gl,1,&buffer);
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(GVar2,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x570);
  glu::CallLogWrapper::glBindVertexArray(&gl,vao.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindVertexBuffer(&gl,0,buffer,0,0);
  GVar2 = glu::CallLogWrapper::glGetError(&gl);
  if (GVar2 != 0x502) {
    local_1a0.m_log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = &local_1a0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"ERROR! Expected GL_INVALID_OPERATION, got ");
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this_00);
    tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
    description = "Invalid error";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(GVar2 != 0x502),
             description);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

BindToCreateCase::IterateResult BindToCreateCase::iterate (void)
{
	glw::GLuint			buffer	= 0;
	glw::GLenum			error;
	glu::CallLogWrapper gl		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	glu::VertexArray	vao		(m_context.getRenderContext());

	gl.enableLogging(true);

	gl.glGenBuffers(1, &buffer);
	gl.glDeleteBuffers(1, &buffer);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "");

	gl.glBindVertexArray(*vao);
	gl.glBindVertexBuffer(0, buffer, 0, 0);

	error = gl.glGetError();

	if (error != GL_INVALID_OPERATION)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR! Expected GL_INVALID_OPERATION, got " << glu::getErrorStr(error) << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}